

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitMatrixCursor.h
# Opt level: O2

this_t * __thiscall
ZXing::BitMatrixCursor<ZXing::PointT<double>_>::movedBy
          (this_t *__return_storage_ptr__,BitMatrixCursor<ZXing::PointT<double>_> *this,
          PointT<double> o)

{
  double dVar1;
  PointT<double> PVar2;
  undefined4 uVar4;
  undefined1 auVar3 [16];
  undefined4 uVar5;
  
  __return_storage_ptr__->img = this->img;
  dVar1 = (this->p).y;
  (__return_storage_ptr__->p).x = o.x + (this->p).x;
  (__return_storage_ptr__->p).y = o.y + dVar1;
  auVar3 = _DAT_0019b270 & (undefined1  [16])this->d;
  uVar4 = auVar3._8_4_;
  uVar5 = auVar3._12_4_;
  if (auVar3._8_8_ <= auVar3._0_8_) {
    uVar4 = auVar3._0_4_;
    uVar5 = auVar3._4_4_;
  }
  auVar3._4_4_ = uVar5;
  auVar3._0_4_ = uVar4;
  auVar3._8_4_ = uVar4;
  auVar3._12_4_ = uVar5;
  PVar2 = (PointT<double>)divpd((undefined1  [16])this->d,auVar3);
  __return_storage_ptr__->d = PVar2;
  return __return_storage_ptr__;
}

Assistant:

this_t movedBy(POINT o) const noexcept { return {*img, p + o, d}; }